

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

void __thiscall
dynet::InputNode::forward_impl
          (InputNode *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs
          ,Tensor *fx)

{
  runtime_error *this_00;
  Tensor *in_RDX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RSI;
  Device_CPU *in_RDI;
  InputNode *unaff_retaddr;
  
  if (in_RDX->device->type == CPU) {
    forward_dev_impl<dynet::Device_CPU>(unaff_retaddr,in_RDI,in_RSI,in_RDX);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid device in MyNode::forward_impl");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SparseInputNode::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 0, "Failed dimension check in FUNCNAME");
  fx.tvec().device(*dev.edevice) = fx.tvec().constant(defdata);
#ifdef __CUDACC__
  unsigned int* ids_ptr = (unsigned int*)aux_mem;
  float* data_ptr = (float*)(ids_ptr + ids.size());
  cudaMemcpyAsync(ids_ptr, &ids[0], ids.size() * sizeof(unsigned int), cudaMemcpyHostToDevice);
  cudaMemcpyAsync(data_ptr, &data[0], data.size() * sizeof(float), cudaMemcpyHostToDevice);
  dynet::gpu::dense_to_sparse_assign(ids.size(), ids_ptr, data_ptr, fx.v);
#else
  for(size_t i = 0; i < ids.size(); ++i)
    fx.v[ids[i]] = data[i];
#endif
}